

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::WeakFulfiller<kj::HttpClient::Response>::disposeImpl
          (WeakFulfiller<kj::HttpClient::Response> *this,void *pointer)

{
  PromiseFulfiller<kj::HttpClient::Response> *pPVar1;
  int iVar2;
  Array<char> local_190;
  Exception local_178;
  
  if (this->inner != (PromiseFulfiller<kj::HttpClient::Response> *)0x0) {
    iVar2 = (*this->inner->_vptr_PromiseFulfiller[2])();
    if ((char)iVar2 != '\0') {
      pPVar1 = this->inner;
      heapString((String *)&local_190,
                 "PromiseFulfiller was destroyed without fulfilling the promise.");
      Exception::Exception
                (&local_178,FAILED,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/../kj/async-inl.h"
                 ,0x430,(String *)&local_190);
      (*pPVar1->_vptr_PromiseFulfiller[1])(pPVar1,&local_178);
      Exception::~Exception(&local_178);
      Array<char>::~Array(&local_190);
    }
    this->inner = (PromiseFulfiller<kj::HttpClient::Response> *)0x0;
    return;
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    // TODO(perf): Factor some of this out so it isn't regenerated for every fulfiller type?

    if (inner == nullptr) {
      // Already detached.
      delete this;
    } else {
      if (inner->isWaiting()) {
        inner->reject(kj::Exception(kj::Exception::Type::FAILED, __FILE__, __LINE__,
            kj::heapString("PromiseFulfiller was destroyed without fulfilling the promise.")));
      }
      inner = nullptr;
    }
  }